

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ObjFileParser.cpp
# Opt level: O0

int __thiscall Assimp::ObjFileParser::getMaterialIndex(ObjFileParser *this,string *strMaterialName)

{
  __type _Var1;
  ulong uVar2;
  pointer pMVar3;
  size_type sVar4;
  reference __rhs;
  ulong local_30;
  size_t index;
  int mat_index;
  string *strMaterialName_local;
  ObjFileParser *this_local;
  
  index._4_4_ = -1;
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    local_30 = 0;
    while( true ) {
      pMVar3 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      sVar4 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size(&pMVar3->m_MaterialLib);
      if (sVar4 <= local_30) break;
      pMVar3 = std::unique_ptr<Assimp::ObjFile::Model,_std::default_delete<Assimp::ObjFile::Model>_>
               ::operator->(&this->m_pModel);
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[](&pMVar3->m_MaterialLib,local_30);
      _Var1 = std::operator==(strMaterialName,__rhs);
      if (_Var1) {
        index._4_4_ = (int)local_30;
        break;
      }
      local_30 = local_30 + 1;
    }
    this_local._4_4_ = index._4_4_;
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int ObjFileParser::getMaterialIndex( const std::string &strMaterialName )
{
    int mat_index = -1;
    if( strMaterialName.empty() ) {
        return mat_index;
    }
    for (size_t index = 0; index < m_pModel->m_MaterialLib.size(); ++index)
    {
        if ( strMaterialName == m_pModel->m_MaterialLib[ index ])
        {
            mat_index = (int)index;
            break;
        }
    }
    return mat_index;
}